

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O2

iterator * __thiscall
ft::multiset<int,_ft::greater<int>,_ft::allocator<int>_>::insert
          (iterator *__return_storage_ptr__,
          multiset<int,_ft::greater<int>,_ft::allocator<int>_> *this,value_type *val)

{
  size_type *psVar1;
  node *z;
  
  z = BSTinsert(this,(this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
                     super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.
                     m_root,val);
  treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::fixInsertViolation
            ((treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *)this,z);
  psVar1 = &(this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
            super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_size;
  *psVar1 = *psVar1 + 1;
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcf0;
  __return_storage_ptr__->m_tree =
       &(this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
        super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree;
  __return_storage_ptr__->m_node = z;
  return __return_storage_ptr__;
}

Assistant:

iterator	insert(value_type const & val) {
		node*	ret = this->BSTinsert(this->root(), val);

		this->fixInsertViolation(ret);
		++this->m_size;
		return iterator(this->m_tree, ret);
	}